

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O3

void __thiscall Material::passToShader(Material *this)

{
  GLfloat *pGVar1;
  PFNGLUNIFORM3FPROC p_Var2;
  PFNGLUNIFORM4FPROC p_Var3;
  PFNGLUNIFORM1FPROC p_Var4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORMMATRIX4FVPROC p_Var6;
  GLint GVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  _Self __tmp;
  GLenum GVar11;
  GLfloat GStack_78;
  GLfloat GStack_74;
  mat4 mat;
  
  p_Var8 = (this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = __glewUniform3f;
  while (__glewUniform3f = p_Var2,
        (_Rb_tree_header *)p_Var8 != &(this->vec3Uniforms)._M_t._M_impl.super__Rb_tree_header) {
    pGVar1 = *(GLfloat **)(p_Var8 + 2);
    GVar7 = (*__glewGetUniformLocation)(this->shader->programId,*(GLchar **)(p_Var8 + 1));
    (*p_Var2)(GVar7,*pGVar1,pGVar1[1],pGVar1[2]);
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var2 = __glewUniform3f;
  }
  p_Var8 = (this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = __glewUniform4f;
  while (__glewUniform4f = p_Var3,
        (_Rb_tree_header *)p_Var8 != &(this->vec4Uniforms)._M_t._M_impl.super__Rb_tree_header) {
    pGVar1 = *(GLfloat **)(p_Var8 + 2);
    GVar7 = (*__glewGetUniformLocation)(this->shader->programId,*(GLchar **)(p_Var8 + 1));
    (*p_Var3)(GVar7,*pGVar1,pGVar1[1],pGVar1[2],pGVar1[3]);
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var3 = __glewUniform4f;
  }
  p_Var9 = (this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->mat4Uniforms)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var10) {
    do {
      p_Var6 = __glewUniformMatrix4fv;
      pGVar1 = *(GLfloat **)(p_Var9 + 2);
      GStack_78 = *pGVar1;
      GStack_74 = pGVar1[1];
      mat.value[0].field_0.field_0.x = pGVar1[2];
      mat.value[0].field_0.field_0.y = pGVar1[3];
      mat.value[0].field_0.field_0.z = pGVar1[4];
      mat.value[0].field_0.field_0.w = pGVar1[5];
      mat.value[1].field_0.field_0.x = pGVar1[6];
      mat.value[1].field_0.field_0.y = pGVar1[7];
      mat.value[1].field_0.field_0.z = pGVar1[8];
      mat.value[1].field_0.field_0.w = pGVar1[9];
      mat.value[2].field_0.field_0.x = pGVar1[10];
      mat.value[2].field_0.field_0.y = pGVar1[0xb];
      mat.value[2].field_0.field_0.z = pGVar1[0xc];
      mat.value[2].field_0.field_0.w = pGVar1[0xd];
      mat.value[3].field_0.field_0.x = pGVar1[0xe];
      mat.value[3].field_0.field_0.y = pGVar1[0xf];
      GVar7 = (*__glewGetUniformLocation)(this->shader->programId,*(GLchar **)(p_Var9 + 1));
      (*p_Var6)(GVar7,1,'\0',&GStack_78);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var10);
  }
  p_Var8 = (this->floatUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = __glewUniform1f;
  while ((_Rb_tree_header *)p_Var8 != &(this->floatUniforms)._M_t._M_impl.super__Rb_tree_header) {
    __glewUniform1f = p_Var4;
    GVar7 = (*__glewGetUniformLocation)(this->shader->programId,*(GLchar **)(p_Var8 + 1));
    (*p_Var4)(GVar7,**(GLfloat **)(p_Var8 + 2));
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var4 = __glewUniform1f;
  }
  p_Var8 = (this->intUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (__glewUniform1f = p_Var4,
        (_Rb_tree_header *)p_Var8 != &(this->intUniforms)._M_t._M_impl.super__Rb_tree_header) {
    GVar7 = (*__glewGetUniformLocation)(this->shader->programId,*(GLchar **)(p_Var8 + 1));
    (*p_Var4)(GVar7,(float)**(int **)(p_Var8 + 2));
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    p_Var4 = __glewUniform1f;
  }
  p_Var9 = (this->textureUniforms)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var10 = &(this->textureUniforms)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var10) {
    GVar11 = 0x84c0;
    mat.value[3].field_0._8_8_ = this;
    do {
      (*__glewActiveTexture)(GVar11);
      glBindTexture(0xde1,*(undefined4 *)(*(long *)(p_Var9 + 2) + 8));
      p_Var5 = __glewUniform1i;
      GVar7 = (*__glewGetUniformLocation)
                        (*(GLuint *)(*(long *)(mat.value[3].field_0._8_8_ + 8) + 8),
                         *(GLchar **)(p_Var9 + 1));
      (*p_Var5)(GVar7,GVar11 - 0x84c0);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      GVar11 = GVar11 + 1;
    } while ((_Rb_tree_header *)p_Var9 != p_Var10);
  }
  return;
}

Assistant:

void Material::passToShader()
{
	std::map<std::string, glm::vec3*>::iterator itv3;
	for (itv3 = vec3Uniforms.begin(); itv3 != vec3Uniforms.end(); itv3++)
	{
		glm::vec3* vec = itv3->second;
		glUniform3f(glGetUniformLocation(shader->getProgramId(), itv3->first.c_str()), vec->x, vec->y, vec->z);
	}

	std::map<std::string, glm::vec4*>::iterator itv4;
	for (itv4 = vec4Uniforms.begin(); itv4 != vec4Uniforms.end(); itv4++)
	{
		glm::vec4* vec = itv4->second;
		glUniform4f(glGetUniformLocation(shader->getProgramId(), itv4->first.c_str()), vec->x, vec->y, vec->z, vec->w);
	}

	std::map<std::string, glm::mat4*>::iterator itm4;
	for (itm4 = mat4Uniforms.begin(); itm4 != mat4Uniforms.end(); itm4++)
	{
		glm::mat4 mat = *itm4->second;
		glUniformMatrix4fv(glGetUniformLocation(shader->getProgramId(), itm4->first.c_str()), 1, GL_FALSE, &mat[0][0]);
	}

	std::map<std::string, float*>::iterator itf;
	for (itf = floatUniforms.begin(); itf != floatUniforms.end(); itf++)
	{
		glUniform1f(glGetUniformLocation(shader->getProgramId(), itf->first.c_str()), *itf->second);
	}

	std::map<std::string, int*>::iterator iti;
	for (iti = intUniforms.begin(); iti != intUniforms.end(); iti++)
	{
		glUniform1f(glGetUniformLocation(shader->getProgramId(), iti->first.c_str()), *iti->second);
	}


	std::map<std::string, Texture*>::iterator itt;
	int textureIndex = 0;
	for (itt = textureUniforms.begin(); itt != textureUniforms.end(); itt++)
	{
		glActiveTexture(GL_TEXTURE0 + textureIndex);
		glBindTexture(GL_TEXTURE_2D, itt->second->getTextureBuffer());
		glUniform1i(glGetUniformLocation(shader->getProgramId(), itt->first.c_str()), textureIndex);
		textureIndex++;
	}

}